

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O1

shared_ptr<QPDFStreamFilter> SF_FlateLzwDecode::lzw_factory(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var1;
  element_type *in_RDI;
  shared_ptr<QPDFStreamFilter> sVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x48);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_002f2fb8;
  pp_Var1[2] = (_func_int *)&PTR__SF_FlateLzwDecode_002f2e70;
  *(undefined1 *)(pp_Var1 + 3) = 1;
  *(undefined8 *)((long)pp_Var1 + 0x1c) = 0x100000001;
  *(undefined8 *)((long)pp_Var1 + 0x24) = 0x800000001;
  *(undefined1 *)((long)pp_Var1 + 0x2c) = 1;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  in_RDI->_vptr_QPDFStreamFilter = pp_Var1 + 2;
  in_RDI[1]._vptr_QPDFStreamFilter = pp_Var1;
  sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&PTR_contentSize_002f2e00 + 1);
  sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<QPDFStreamFilter>)
         sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFStreamFilter>
SF_FlateLzwDecode::lzw_factory()
{
    return std::make_shared<SF_FlateLzwDecode>(true);
}